

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

LY_ERR moveto_axis_scnode_next_first
                 (lysc_node **iter,lyxp_node_type *iter_type,lys_module **iter_mod,
                 uint32_t *iter_mod_idx,lysc_node *scnode,lyxp_node_type node_type,lyxp_axis axis,
                 lyxp_set *set,uint32_t getnext_opts)

{
  lys_module *plVar1;
  lysc_node *plVar2;
  lyxp_node_type lVar3;
  lysc_module *module;
  lysc_node *last;
  
  if (*iter != (lysc_node *)0x0) {
    __assert_fail("!*iter",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x195d,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  }
  if (*iter_type != LYXP_NODE_NONE) {
    __assert_fail("!*iter_type",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x195e,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  }
  *iter_mod = (lys_module *)0x0;
  *iter_mod_idx = 0;
  switch(axis) {
  case LYXP_AXIS_ANCESTOR:
  case LYXP_AXIS_PARENT:
    if (node_type == LYXP_NODE_ELEM) {
      if (scnode == (lysc_node *)0x0) {
        plVar2 = (lysc_node *)0x0;
      }
      else {
        plVar2 = scnode->parent;
      }
      plVar2 = lysc_data_node(plVar2);
      lVar3 = LYXP_NODE_ELEM;
      if (plVar2 == (lysc_node *)0x0) {
        lVar3 = set->root_type;
      }
      goto LAB_001b2b9f;
    }
    break;
  case LYXP_AXIS_ANCESTOR_OR_SELF:
  case LYXP_AXIS_DESCENDANT_OR_SELF:
  case LYXP_AXIS_SELF:
    plVar2 = (lysc_node *)0x0;
    lVar3 = LYXP_NODE_NONE;
    if (node_type - LYXP_NODE_ROOT < 3) {
      plVar2 = scnode;
      lVar3 = node_type;
    }
    goto LAB_001b2b9f;
  case LYXP_AXIS_ATTRIBUTE:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                  0x19a6,
                  "LY_ERR moveto_axis_scnode_next_first(const struct lysc_node **, enum lyxp_node_type *, const struct lys_module **, uint32_t *, const struct lysc_node *, enum lyxp_node_type, enum lyxp_axis, struct lyxp_set *, uint32_t)"
                 );
  case LYXP_AXIS_CHILD:
  case LYXP_AXIS_DESCENDANT:
    if (node_type - LYXP_NODE_ROOT < 2) {
      plVar1 = ly_ctx_get_module_iter(set->ctx,iter_mod_idx);
      *iter_mod = plVar1;
      while (plVar1 != (lys_module *)0x0) {
        if ((plVar1->compiled != (lysc_module *)0x0) &&
           (plVar2 = lys_getnext((lysc_node *)0x0,(lysc_node *)0x0,plVar1->compiled,getnext_opts),
           plVar2 != (lysc_node *)0x0)) {
          lVar3 = LYXP_NODE_ELEM;
          goto LAB_001b2b9f;
        }
        plVar1 = ly_ctx_get_module_iter(set->ctx,iter_mod_idx);
        *iter_mod = plVar1;
      }
    }
    else if (node_type == LYXP_NODE_ELEM) {
      last = (lysc_node *)0x0;
      module = (lysc_module *)0x0;
      plVar2 = scnode;
      goto LAB_001b2b8b;
    }
    break;
  case LYXP_AXIS_FOLLOWING:
  case LYXP_AXIS_FOLLOWING_SIBLING:
    if (node_type == LYXP_NODE_ELEM) {
      if (scnode == (lysc_node *)0x0) {
        plVar2 = (lysc_node *)0x0;
      }
      else {
        plVar2 = scnode->parent;
      }
      plVar2 = lysc_data_node(plVar2);
      module = scnode->module->compiled;
      last = scnode;
LAB_001b2b8b:
      plVar2 = lys_getnext(last,plVar2,module,getnext_opts);
LAB_001b2b94:
      lVar3 = (uint)(plVar2 != (lysc_node *)0x0) * 3;
      goto LAB_001b2b9f;
    }
    break;
  case LYXP_AXIS_PRECEDING:
  case LYXP_AXIS_PRECEDING_SIBLING:
    if (node_type == LYXP_NODE_ELEM) {
      if (scnode == (lysc_node *)0x0) {
        plVar2 = (lysc_node *)0x0;
      }
      else {
        plVar2 = scnode->parent;
      }
      plVar2 = lysc_data_node(plVar2);
      plVar2 = lys_getnext((lysc_node *)0x0,plVar2,scnode->module->compiled,getnext_opts);
      if (plVar2 == scnode) {
        plVar2 = (lysc_node *)0x0;
      }
      goto LAB_001b2b94;
    }
  }
  plVar2 = (lysc_node *)0x0;
  lVar3 = LYXP_NODE_NONE;
LAB_001b2b9f:
  *iter = plVar2;
  *iter_type = lVar3;
  return (uint)(lVar3 == LYXP_NODE_NONE) * 5;
}

Assistant:

static LY_ERR
moveto_axis_scnode_next_first(const struct lysc_node **iter, enum lyxp_node_type *iter_type, const struct lys_module **iter_mod,
        uint32_t *iter_mod_idx, const struct lysc_node *scnode, enum lyxp_node_type node_type, enum lyxp_axis axis,
        struct lyxp_set *set, uint32_t getnext_opts)
{
    const struct lysc_node *next = NULL;
    enum lyxp_node_type next_type = 0;

    assert(!*iter);
    assert(!*iter_type);

    *iter_mod = NULL;
    *iter_mod_idx = 0;

    switch (axis) {
    case LYXP_AXIS_ANCESTOR_OR_SELF:
    case LYXP_AXIS_DESCENDANT_OR_SELF:
    case LYXP_AXIS_SELF:
        if ((node_type == LYXP_NODE_ROOT_CONFIG) || (node_type == LYXP_NODE_ROOT) || (node_type == LYXP_NODE_ELEM)) {
            /* just return the node */
            next = scnode;
            next_type = node_type;
        }
        break;

    case LYXP_AXIS_ANCESTOR:
    case LYXP_AXIS_PARENT:
        if (node_type == LYXP_NODE_ELEM) {
            next = lysc_data_parent(scnode);
            next_type = next ? LYXP_NODE_ELEM : set->root_type;
        } /* else no parent */
        break;

    case LYXP_AXIS_DESCENDANT:
    case LYXP_AXIS_CHILD:
        if ((node_type == LYXP_NODE_ROOT_CONFIG) || (node_type == LYXP_NODE_ROOT)) {
            /* it can actually be in any module, it's all <running>, and even if it's moveto_mod (if set),
             * it can be in a top-level augment */
            while ((*iter_mod = ly_ctx_get_module_iter(set->ctx, iter_mod_idx))) {
                /* module may not be implemented or not compiled yet */
                if (!(*iter_mod)->compiled) {
                    continue;
                }

                /* get next node */
                if ((next = lys_getnext(NULL, NULL, (*iter_mod)->compiled, getnext_opts))) {
                    next_type = LYXP_NODE_ELEM;
                    break;
                }
            }
        } else if (node_type == LYXP_NODE_ELEM) {
            /* get next node */
            next = lys_getnext(NULL, scnode, NULL, getnext_opts);
            next_type = next ? LYXP_NODE_ELEM : 0;
        }
        break;

    case LYXP_AXIS_FOLLOWING:
    case LYXP_AXIS_FOLLOWING_SIBLING:
        if (node_type == LYXP_NODE_ELEM) {
            /* first next sibling */
            next = lys_getnext(scnode, lysc_data_parent(scnode), scnode->module->compiled, getnext_opts);
            next_type = next ? LYXP_NODE_ELEM : 0;
        } /* else no sibling */
        break;

    case LYXP_AXIS_PRECEDING:
    case LYXP_AXIS_PRECEDING_SIBLING:
        if (node_type == LYXP_NODE_ELEM) {
            /* first parent sibling */
            next = lys_getnext(NULL, lysc_data_parent(scnode), scnode->module->compiled, getnext_opts);
            if (next == scnode) {
                /* no preceding sibling */
                next = NULL;
            }
            next_type = next ? LYXP_NODE_ELEM : 0;
        } /* else no sibling */
        break;

    case LYXP_AXIS_ATTRIBUTE:
        /* unreachable */
        assert(0);
        LOGINT(set->ctx);
        break;
    }

    *iter = next;
    *iter_type = next_type;
    return next_type ? LY_SUCCESS : LY_ENOTFOUND;
}